

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  undefined4 extraout_EAX;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uchar *a;
  undefined1 auVar4 [16];
  int overflow;
  secp256k1_fe xd;
  secp256k1_gej rj;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe px;
  secp256k1_fe xn;
  secp256k1_fe i;
  secp256k1_ge p;
  uint local_254;
  uchar *local_250;
  uchar *local_248;
  secp256k1_fe local_240;
  secp256k1_gej local_218;
  secp256k1_scalar local_198;
  secp256k1_fe local_178;
  secp256k1_fe local_150;
  secp256k1_fe local_128;
  secp256k1_fe local_100;
  secp256k1_fe local_d8;
  secp256k1_fe local_b0;
  secp256k1_ge local_88;
  
  if (output == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "output != NULL";
  }
  else if (ell_a64 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "ell_a64 != NULL";
  }
  else if (ell_b64 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "ell_b64 != NULL";
  }
  else if (seckey32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "seckey32 != NULL";
  }
  else {
    if (hashfp != (secp256k1_ellswift_xdh_hash_function)0x0) {
      a = ell_a64;
      if (party == 0) {
        a = ell_b64;
      }
      local_250 = output;
      local_248 = ell_b64;
      secp256k1_fe_impl_set_b32_mod(&local_128,a);
      secp256k1_fe_impl_set_b32_mod(&local_150,a + 0x20);
      secp256k1_ellswift_xswiftec_frac_var(&local_d8,&local_240,&local_128,&local_150);
      secp256k1_scalar_set_b32(&local_198,seckey32,(int *)&local_254);
      auVar4._0_4_ = -(uint)((int)local_198.d[2] == 0 && (int)local_198.d[0] == 0);
      auVar4._4_4_ = -(uint)(local_198.d[2]._4_4_ == 0 && local_198.d[0]._4_4_ == 0);
      auVar4._8_4_ = -(uint)((int)local_198.d[3] == 0 && (int)local_198.d[1] == 0);
      auVar4._12_4_ = -(uint)(local_198.d[3]._4_4_ == 0 && local_198.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar4);
      local_254 = (uint)(iVar1 == 0xf);
      secp256k1_scalar_cmov(&local_198,&secp256k1_scalar_one,local_254);
      secp256k1_fe_impl_sqr(&local_178,&local_d8);
      secp256k1_fe_impl_mul(&local_178,&local_178,&local_d8);
      secp256k1_fe_impl_sqr(&local_218.x,&local_240);
      local_218.x.n[0] = local_218.x.n[0] * 7;
      local_218.x.n[1] = local_218.x.n[1] * 7;
      local_218.x.n[2] = local_218.x.n[2] * 7;
      local_218.x.n[3] = local_218.x.n[3] * 7;
      local_218.x.n[4] = local_218.x.n[4] * 7;
      secp256k1_fe_impl_mul(&local_218.x,&local_218.x,&local_240);
      local_178.n[2] = local_178.n[2] + local_218.x.n[2];
      local_178.n[3] = local_178.n[3] + local_218.x.n[3];
      local_178.n[4] = local_178.n[4] + local_218.x.n[4];
      local_178.n[0] = local_178.n[0] + local_218.x.n[0];
      local_178.n[1] = local_178.n[1] + local_218.x.n[1];
      secp256k1_fe_impl_mul(&local_88.x,&local_178,&local_d8);
      secp256k1_fe_impl_sqr(&local_88.y,&local_178);
      local_88.infinity = 0;
      secp256k1_ecmult_const(&local_218,&local_88,&local_198);
      secp256k1_fe_impl_sqr(&local_b0,&local_218.z);
      secp256k1_fe_impl_mul(&local_b0,&local_b0,&local_178);
      secp256k1_fe_impl_mul(&local_b0,&local_b0,&local_240);
      secp256k1_fe_impl_inv(&local_b0,&local_b0);
      secp256k1_fe_impl_mul(&local_100,&local_218.x,&local_b0);
      secp256k1_fe_impl_normalize(&local_100);
      secp256k1_fe_impl_get_b32((uchar *)&local_218,&local_100);
      iVar1 = (*hashfp)(local_250,(uchar *)&local_218,ell_a64,local_248,data);
      secp256k1_fe_impl_clear(&local_100);
      return (uint)(local_254 == 0 && iVar1 != 0);
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "hashfp != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    memset(sx, 0, 32);
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}